

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O1

void re2c::genYYFill(OutputFile *o,size_t need)

{
  pointer pcVar1;
  opt_t *poVar2;
  OutputFile *pOVar3;
  size_t local_60;
  string local_58;
  string local_38;
  
  local_60 = need;
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  pcVar1 = (poVar2->fill)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (poVar2->fill)._M_string_length);
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  replaceParam<unsigned_long>(&local_38,&local_58,&poVar2->fill_arg,&local_60);
  OutputFile::wstring(o,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (poVar2->fill_naked == false) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar2->fill_arg_use == true) {
      pOVar3 = OutputFile::ws(o,"(");
      pOVar3 = OutputFile::wu64(pOVar3,local_60);
      OutputFile::ws(pOVar3,")");
    }
    OutputFile::ws(o,";");
  }
  OutputFile::ws(o,"\n");
  return;
}

Assistant:

void genYYFill (OutputFile & o, size_t need)
{
	o.wstring(replaceParam (opts->fill, opts->fill_arg, need));
	if (!opts->fill_naked)
	{
		if (opts->fill_arg_use)
		{
			o.ws("(").wu64(need).ws(")");
		}
		o.ws(";");
	}
	o.ws("\n");
}